

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O0

bool __thiscall
ktxValidator::validationContext::extractFormatInfo(validationContext *this,uint32_t *dfd)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  InterpretDFDResult result;
  InterpretedDFDChannel a;
  InterpretedDFDChannel b;
  InterpretedDFDChannel g;
  InterpretedDFDChannel r;
  formatInfo *fi;
  uint32_t *bdb;
  undefined1 local_48 [8];
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  undefined1 local_30 [8];
  int *local_28;
  long local_20;
  
  local_20 = in_RSI + 4;
  local_28 = (int *)(in_RDI + 0x8c);
  *local_28 = (*(uint *)(in_RSI + 0x10) & 0xff) + 1;
  *(uint *)(in_RDI + 0x90) = (*(uint *)(in_RSI + 0x10) >> 8 & 0xff) + 1;
  *(uint *)(in_RDI + 0x94) = (*(uint *)(in_RSI + 0x10) >> 0x10 & 0xff) + 1;
  *(uint *)(in_RDI + 0x9c) = *(uint *)(in_RSI + 0x14) & 0xff;
  if ((*(uint *)(in_RSI + 0xc) & 0xff) < 0x80) {
    *(undefined1 *)(in_RDI + 0xa0) = 0;
    iVar1 = interpretDFD(in_RSI,local_30,local_38,local_40,local_48,in_RDI + 0x98);
    if (0x200 < iVar1) {
      return false;
    }
  }
  else {
    *(undefined1 *)(in_RDI + 0xa0) = 1;
  }
  return true;
}

Assistant:

bool extractFormatInfo(uint32_t* dfd) {
            uint32_t* bdb = dfd + 1;
            struct formatInfo& fi = formatInfo;
            fi.blockDimension.x = KHR_DFDVAL(bdb, TEXELBLOCKDIMENSION0) + 1;
            fi.blockDimension.y = KHR_DFDVAL(bdb, TEXELBLOCKDIMENSION1) + 1;
            fi.blockDimension.z = KHR_DFDVAL(bdb, TEXELBLOCKDIMENSION2) + 1;
            fi.blockByteLength = KHR_DFDVAL(bdb, BYTESPLANE0);
            if (KHR_DFDVAL(bdb, MODEL) >= KHR_DF_MODEL_DXT1A) {
                // A block compressed format. Entire block is a single sample.
                fi.isBlockCompressed = true;
            } else {
                // An uncompressed format.
                InterpretedDFDChannel r, g, b, a;
                InterpretDFDResult result;

                fi.isBlockCompressed = false;
                result = interpretDFD(dfd, &r, &g, &b, &a, &fi.wordSize);
                if (result > i_UNSUPPORTED_ERROR_BIT)
                    return false;
            }
            return true;
        }